

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRoof::~IfcRoof(IfcRoof *this)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)this + -0x18);
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoof,_1UL>).field_0x20 +
                   lVar2);
  plVar1[-0x2d] = 0x938de8;
  plVar1[2] = 0x938f00;
  plVar1[-0x1c] = 0x938e10;
  plVar1[-0x1a] = 0x938e38;
  plVar1[-0x13] = 0x938e60;
  plVar1[-0xd] = 0x938e88;
  plVar1[-6] = 0x938eb0;
  plVar1[-4] = 0x938ed8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)(&this->field_0x0 + lVar2),&PTR_construction_vtable_24__00938f20);
  operator_delete((IfcElement *)(&this->field_0x0 + lVar2),400);
  return;
}

Assistant:

IfcRoof() : Object("IfcRoof") {}